

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void rsg::anon_unknown_27::fillUndefinedComponents(ValueRangeAccess valueRange)

{
  Scalar **__return_storage_ptr__;
  ConstValueRangeAccess valueRange_00;
  bool bVar1;
  Type TVar2;
  deBool dVar3;
  int iVar4;
  VariableType *pVVar5;
  TestError *this;
  Scalar *in_stack_ffffffffffffff30;
  ValueRangeAccess local_a0;
  undefined1 local_88 [8];
  ValueAccess max;
  undefined1 local_60 [8];
  ValueAccess min;
  undefined8 local_48;
  undefined8 local_40;
  int local_20;
  int elemNdx;
  Type baseType;
  
  pVVar5 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
  TVar2 = VariableType::getBaseType(pVVar5);
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
         (((TVar2 == TYPE_FLOAT || (TVar2 == TYPE_INT)) || (TVar2 == TYPE_BOOL))))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      local_20 = 0;
      while( true ) {
        pVVar5 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
        iVar4 = VariableType::getNumElements(pVVar5);
        if (iVar4 <= local_20) break;
        ValueRangeAccess::component
                  ((ValueRangeAccess *)&min.super_ConstStridedValueAccess<1>.m_value,
                   (ValueRangeAccess *)&stack0x00000008,local_20);
        valueRange_00.m_min = (Scalar *)local_40;
        valueRange_00.m_type = (VariableType *)local_48;
        valueRange_00.m_max = in_stack_ffffffffffffff30;
        bVar1 = isUndefinedValueRange(valueRange_00);
        if (bVar1) {
          __return_storage_ptr__ = &max.super_ConstStridedValueAccess<1>.m_value;
          ValueRangeAccess::component
                    ((ValueRangeAccess *)__return_storage_ptr__,(ValueRangeAccess *)&stack0x00000008
                     ,local_20);
          _local_60 = (ConstStridedValueAccess<1>)
                      ValueRangeAccess::getMin((ValueRangeAccess *)__return_storage_ptr__);
          ValueRangeAccess::component(&local_a0,(ValueRangeAccess *)&stack0x00000008,local_20);
          _local_88 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax(&local_a0);
          if (TVar2 == TYPE_FLOAT) {
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_60,0.0);
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_88,1.0);
          }
          else if (TVar2 == TYPE_INT) {
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_60,0);
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_88,1);
          }
          else if (TVar2 == TYPE_BOOL) {
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_60,false);
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)local_88,true);
          }
        }
        local_20 = local_20 + 1;
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,
             "baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT || baseType == VariableType::TYPE_BOOL"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
             ,0x8e);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void fillUndefinedComponents (ValueRangeAccess valueRange)
{
	VariableType::Type baseType = valueRange.getType().getBaseType();
	TCU_CHECK(baseType == VariableType::TYPE_FLOAT	||
			  baseType == VariableType::TYPE_INT	||
			  baseType == VariableType::TYPE_BOOL);

	for (int elemNdx = 0; elemNdx < valueRange.getType().getNumElements(); elemNdx++)
	{
		if (isUndefinedValueRange(valueRange.component(elemNdx)))
		{
			ValueAccess min = valueRange.component(elemNdx).getMin();
			ValueAccess max = valueRange.component(elemNdx).getMax();

			switch (baseType)
			{
				case VariableType::TYPE_FLOAT:	min = 0.0f;		max = 1.0f;		break;
				case VariableType::TYPE_INT:	min = 0;		max = 1;		break;
				case VariableType::TYPE_BOOL:	min = false;	max = true;		break;
				default: DE_ASSERT(DE_FALSE);
			}
		}
	}
}